

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterXsYs<float> *pGVar6;
  TransformerLinLog *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  int iVar16;
  long lVar17;
  ImDrawIdx IVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  pIVar15 = GImPlot;
  pGVar6 = this->Getter;
  pTVar7 = this->Transformer;
  iVar16 = pGVar6->Count;
  lVar17 = (long)(((pGVar6->Offset + prim + 1) % iVar16 + iVar16) % iVar16) * (long)pGVar6->Stride;
  fVar23 = *(float *)((long)pGVar6->Xs + lVar17);
  dVar12 = log10((double)*(float *)((long)pGVar6->Ys + lVar17) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar16 = pTVar7->YAxis;
  pIVar8 = pIVar15->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar16].Range.Min;
  IVar2 = pIVar15->PixelRange[iVar16].Min;
  fVar19 = (float)(pIVar15->Mx * ((double)fVar23 - (pIVar8->XAxis).Range.Min) + (double)IVar2.x);
  fVar20 = (float)(pIVar15->My[iVar16] *
                   (((double)(float)(dVar12 / pIVar15->LogDenY[iVar16]) *
                     (pIVar8->YAxis[iVar16].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  fVar21 = (this->P1).x;
  fVar22 = (this->P1).y;
  auVar26._0_4_ = ~-(uint)(fVar19 <= fVar21) & (uint)fVar19;
  auVar26._4_4_ = ~-(uint)(fVar20 <= fVar22) & (uint)fVar20;
  auVar26._8_4_ = ~-(uint)(fVar21 < fVar19) & (uint)fVar19;
  auVar26._12_4_ = ~-(uint)(fVar22 < fVar20) & (uint)fVar20;
  auVar13._4_4_ = (uint)fVar22 & -(uint)(fVar20 <= fVar22);
  auVar13._0_4_ = (uint)fVar21 & -(uint)(fVar19 <= fVar21);
  auVar13._8_4_ = (uint)fVar21 & -(uint)(fVar21 < fVar19);
  auVar13._12_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar20);
  auVar26 = auVar26 | auVar13;
  fVar23 = (cull_rect->Min).y;
  auVar14._4_8_ = auVar26._8_8_;
  auVar14._0_4_ = -(uint)(auVar26._4_4_ < fVar23);
  auVar27._0_8_ = auVar14._0_8_ << 0x20;
  auVar27._8_4_ = -(uint)(auVar26._8_4_ < (cull_rect->Max).x);
  auVar27._12_4_ = -(uint)(auVar26._12_4_ < (cull_rect->Max).y);
  auVar28._4_4_ = -(uint)(fVar23 < auVar26._4_4_);
  auVar28._0_4_ = -(uint)((cull_rect->Min).x < auVar26._0_4_);
  auVar28._8_8_ = auVar27._8_8_;
  iVar16 = movmskps((int)pIVar8,auVar28);
  if (iVar16 == 0xf) {
    IVar4 = this->Col;
    IVar2 = *uv;
    fVar23 = fVar19 - fVar21;
    fVar24 = fVar20 - fVar22;
    fVar25 = fVar23 * fVar23 + fVar24 * fVar24;
    if (0.0 < fVar25) {
      fVar25 = 1.0 / SQRT(fVar25);
      fVar23 = fVar23 * fVar25;
      fVar24 = fVar24 * fVar25;
    }
    fVar25 = this->Weight * 0.5;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar4;
    fVar23 = fVar25 * fVar23;
    fVar25 = fVar25 * fVar24;
    (pIVar9->pos).x = fVar21 + fVar25;
    (pIVar9->pos).y = fVar22 - fVar23;
    pIVar10[1].pos.x = fVar25 + fVar19;
    pIVar10[1].pos.y = fVar20 - fVar23;
    pIVar10[1].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar4;
    pIVar9[2].pos.x = fVar19 - fVar25;
    pIVar9[2].pos.y = fVar23 + fVar20;
    pIVar9[2].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar4;
    IVar3 = this->P1;
    pIVar9[3].pos.x = IVar3.x - fVar25;
    pIVar9[3].pos.y = IVar3.y + fVar23;
    pIVar9[3].uv.x = IVar2.x;
    pIVar9[3].uv.y = IVar2.y;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar5;
    *pIVar11 = IVar18;
    pIVar11[1] = IVar18 + 1;
    pIVar11[2] = IVar18 + 2;
    pIVar11[3] = IVar18;
    pIVar11[4] = IVar18 + 2;
    pIVar11[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  IVar2.y = fVar20;
  IVar2.x = fVar19;
  this->P1 = IVar2;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }